

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::~Clipper(Clipper *this)

{
  ~Clipper(this,&VTT);
  ClipperBase::~ClipperBase((ClipperBase *)&this->field_0x88);
  return;
}

Assistant:

Clipper::~Clipper() //destructor
{
  Clear();
  DisposeScanbeamList();
}